

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,char *subPath,VarType *type)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  VarTokenizer tokenizer;
  VarTokenizer local_78;
  char *local_60;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *local_58;
  Data local_50;
  undefined4 local_48;
  long local_40 [2];
  
  glu::VarTokenizer::VarTokenizer(&local_78,subPath);
  local_48 = 0;
  local_50.type = type;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
            (typePath,(VariablePathComponent *)&local_50);
  bVar2 = true;
  if (local_78.m_token != TOKEN_END) {
    if (type->m_type == TYPE_ARRAY) {
      if (((local_78.m_token == TOKEN_LEFT_BRACKET) &&
          (glu::VarTokenizer::advance(&local_78), local_78.m_token == TOKEN_NUMBER)) &&
         (glu::VarTokenizer::advance(&local_78), local_78.m_token == TOKEN_RIGHT_BRACKET)) {
        bVar2 = traverseVariablePath
                          (typePath,subPath + (local_78.m_tokenLen + local_78.m_tokenStart),
                           (type->m_data).array.elementType);
        return bVar2;
      }
    }
    else if (((type->m_type == TYPE_STRUCT) && (local_78.m_token == TOKEN_PERIOD)) &&
            (glu::VarTokenizer::advance(&local_78), local_78.m_token == TOKEN_IDENTIFIER)) {
      uVar5 = (int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(((type->m_data).structPtr)->m_members).
                                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      uVar6 = (ulong)uVar5;
      if (0 < (int)uVar5) {
        lVar7 = 0x20;
        lVar8 = 0;
        local_60 = subPath;
        local_58 = typePath;
        do {
          local_50.type = (VarType *)local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_78.m_str + local_78.m_tokenStart,
                     local_78.m_str + local_78.m_tokenStart + local_78.m_tokenLen);
          iVar4 = std::__cxx11::string::compare((char *)&local_50);
          if (local_50.type != (VarType *)local_40) {
            operator_delete(local_50.type,local_40[0] + 1);
          }
          if (iVar4 == 0) {
            bVar3 = traverseVariablePath
                              (local_58,local_60 + (local_78.m_tokenLen + local_78.m_tokenStart),
                               (VarType *)
                               ((long)&(((((type->m_data).structPtr)->m_members).
                                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                       _M_dataplus._M_p + lVar7));
            bVar1 = 1;
            goto LAB_016a49ef;
          }
          lVar8 = lVar8 + 1;
          uVar6 = (ulong)((int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                              super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(((type->m_data).structPtr)->m_members).
                                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x49249249);
          lVar7 = lVar7 + 0x38;
        } while (lVar8 < (long)uVar6);
      }
      bVar3 = (byte)uVar6;
      bVar1 = 0;
LAB_016a49ef:
      return (bool)(bVar1 & bVar3);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const char* subPath, const glu::VarType& type)
{
	glu::VarTokenizer tokenizer(subPath);

	typePath.push_back(VariablePathComponent(&type));

	if (tokenizer.getToken() == glu::VarTokenizer::TOKEN_END)
		return true;

	if (type.isStructType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_PERIOD)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_IDENTIFIER)
			return false;

		for (int memberNdx = 0; memberNdx < type.getStructPtr()->getNumMembers(); ++memberNdx)
			if (type.getStructPtr()->getMember(memberNdx).getName() == tokenizer.getIdentifier())
				return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getStructPtr()->getMember(memberNdx).getType());

		// malformed path, no such member
		return false;
	}
	else if (type.isArrayType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_LEFT_BRACKET)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_NUMBER)
			return false;

		tokenizer.advance();
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_RIGHT_BRACKET)
			return false;

		return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getElementType());
	}

	return false;
}